

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O2

void __thiscall
CoreML::Specification::RandomNormalStaticLayerParams::InternalSwap
          (RandomNormalStaticLayerParams *this,RandomNormalStaticLayerParams *other)

{
  float fVar1;
  int iVar2;
  int64 iVar3;
  
  google::protobuf::RepeatedField<unsigned_long>::InternalSwap
            (&this->outputshape_,&other->outputshape_);
  iVar3 = this->seed_;
  this->seed_ = other->seed_;
  other->seed_ = iVar3;
  fVar1 = this->mean_;
  this->mean_ = other->mean_;
  other->mean_ = fVar1;
  fVar1 = this->stddev_;
  this->stddev_ = other->stddev_;
  other->stddev_ = fVar1;
  iVar2 = this->_cached_size_;
  this->_cached_size_ = other->_cached_size_;
  other->_cached_size_ = iVar2;
  return;
}

Assistant:

void RandomNormalStaticLayerParams::InternalSwap(RandomNormalStaticLayerParams* other) {
  outputshape_.InternalSwap(&other->outputshape_);
  std::swap(seed_, other->seed_);
  std::swap(mean_, other->mean_);
  std::swap(stddev_, other->stddev_);
  std::swap(_cached_size_, other->_cached_size_);
}